

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O0

ModelContour *
eos::fitting::ModelContour::load(ModelContour *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  runtime_error *this;
  undefined1 local_430 [8];
  JSONInputArchive input_archive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_228;
  ifstream file;
  string *filename_local;
  ModelContour *contour;
  
  ModelContour(__return_storage_ptr__);
  std::ifstream::ifstream(&local_228,(string *)filename,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    input_archive.itsDocument.parseResult_.offset_._7_1_ = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"Error opening given file: ",filename);
    std::runtime_error::runtime_error(this,(string *)&local_258);
    input_archive.itsDocument.parseResult_.offset_._7_1_ = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cereal::JSONInputArchive::JSONInputArchive((JSONInputArchive *)local_430,(istream *)&local_228);
  cereal::InputArchive<cereal::JSONInputArchive,0u>::operator()
            ((InputArchive<cereal::JSONInputArchive,0u> *)local_430,__return_storage_ptr__);
  cereal::JSONInputArchive::~JSONInputArchive((JSONInputArchive *)local_430);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

static ModelContour load(std::string filename)
    {
        ModelContour contour;

        std::ifstream file(filename);
        if (!file)
        {
            throw std::runtime_error("Error opening given file: " + filename);
        }
        cereal::JSONInputArchive input_archive(file);
        input_archive(contour);

        return contour;
    }